

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

psolver_t btSoftBody::getSolver(_ solver)

{
  if (solver < END) {
    return (psolver_t)(&PTR_PSolve_Links_00221518)[solver];
  }
  return (psolver_t)0x0;
}

Assistant:

btSoftBody::psolver_t	btSoftBody::getSolver(ePSolver::_ solver)
{
	switch(solver)
	{
	case	ePSolver::Anchors:		
		return(&btSoftBody::PSolve_Anchors);
	case	ePSolver::Linear:		
		return(&btSoftBody::PSolve_Links);
	case	ePSolver::RContacts:	
		return(&btSoftBody::PSolve_RContacts);
	case	ePSolver::SContacts:	
		return(&btSoftBody::PSolve_SContacts);	
		default:
		{
		}
	}
	return(0);
}